

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O1

int Intp_ManProcessRoots(Intp_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Sto_Man_t *pSVar3;
  Sto_Cls_t *pSVar4;
  int iVar5;
  uint uVar6;
  
  pSVar3 = p->pCnf;
  pSVar4 = pSVar3->pHead;
  if (pSVar4 == (Sto_Cls_t *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      if (((pSVar3->nClausesA <= iVar5 ^ (byte)*(uint *)&pSVar4->field_0x1c) & 1) == 0) {
        __assert_fail("(int)pClause->fA == (Counter < (int)p->pCnf->nClausesA)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                      ,0x317,"int Intp_ManProcessRoots(Intp_Man_t *)");
      }
      if (((*(uint *)&pSVar4->field_0x1c & 2) == 0) == iVar5 < pSVar3->nRoots) {
        __assert_fail("(int)pClause->fRoot == (Counter < (int)p->pCnf->nRoots)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                      ,0x318,"int Intp_ManProcessRoots(Intp_Man_t *)");
      }
      iVar5 = iVar5 + 1;
      pSVar4 = pSVar4->pNext;
    } while (pSVar4 != (Sto_Cls_t *)0x0);
  }
  if (pSVar3->nClauses != iVar5) {
    __assert_fail("p->pCnf->nClauses == Counter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                  ,0x31b,"int Intp_ManProcessRoots(Intp_Man_t *)");
  }
  if ((*(uint *)&pSVar3->pTail->field_0x1c & 0x7fffff8) != 0) {
    __assert_fail("p->pCnf->pTail->nLits == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                  ,0x31e,"int Intp_ManProcessRoots(Intp_Man_t *)");
  }
  p->nTrailSize = 0;
  for (pSVar4 = pSVar3->pHead;
      (pSVar4 != (Sto_Cls_t *)0x0 && ((*(uint *)&pSVar4->field_0x1c & 2) != 0));
      pSVar4 = pSVar4->pNext) {
    if ((*(uint *)&pSVar4->field_0x1c & 0x7fffff0) != 0) {
      uVar6 = *(uint *)&pSVar4[1].pNext;
      if (((int)uVar6 < 0) || (p->pCnf->nVars <= (int)uVar6 >> 1)) {
LAB_008e7e4b:
        __assert_fail("lit_check(Lit, p->pCnf->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                      ,0x115,"void Intp_ManWatchClause(Intp_Man_t *, Sto_Cls_t *, lit)");
      }
      pSVar4->pNext0 = p->pWatches[(ulong)uVar6 ^ 1];
      p->pWatches[(ulong)uVar6 ^ 1] = pSVar4;
      uVar1 = *(uint *)((long)&pSVar4[1].pNext + 4);
      if (((int)uVar1 < 0) || (p->pCnf->nVars <= (int)uVar1 >> 1)) goto LAB_008e7e4b;
      (&pSVar4->pNext0)[uVar6 != uVar1] = p->pWatches[(ulong)uVar1 ^ 1];
      p->pWatches[uVar1 ^ 1] = pSVar4;
    }
    if ((*(uint *)&pSVar4->field_0x1c & 0x7fffff8) == 8) {
      iVar5 = *(int *)&pSVar4[1].pNext;
      if ((iVar5 < 0) || (uVar6 = iVar5 >> 1, p->pCnf->nVars <= (int)uVar6)) {
        __assert_fail("lit_check(pClause->pLits[0], p->pCnf->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                      ,0x32e,"int Intp_ManProcessRoots(Intp_Man_t *)");
      }
      iVar2 = p->pAssigns[uVar6];
      if (iVar2 == -1) {
        p->pAssigns[uVar6] = iVar5;
        p->pReasons[uVar6] = pSVar4;
        iVar2 = p->nTrailSize;
        p->nTrailSize = iVar2 + 1;
        p->pTrail[iVar2] = iVar5;
      }
      else if (iVar2 != iVar5) {
        Intp_ManProofTraceOne(p,pSVar4,p->pCnf->pEmpty);
        goto LAB_008e7dd2;
      }
    }
  }
  pSVar4 = Intp_ManPropagate(p,0);
  if (pSVar4 == (Sto_Cls_t *)0x0) {
    p->nRootSize = p->nTrailSize;
    iVar5 = 1;
  }
  else {
    Intp_ManProofTraceOne(p,pSVar4,p->pCnf->pEmpty);
LAB_008e7dd2:
    iVar5 = 0;
    if (p->fVerbose != 0) {
      puts("Found root level conflict!");
    }
  }
  return iVar5;
}

Assistant:

int Intp_ManProcessRoots( Intp_Man_t * p )
{
    Sto_Cls_t * pClause;
    int Counter;

    // make sure the root clauses are preceeding the learnt clauses
    Counter = 0;
    Sto_ManForEachClause( p->pCnf, pClause )
    {
        assert( (int)pClause->fA    == (Counter < (int)p->pCnf->nClausesA) );
        assert( (int)pClause->fRoot == (Counter < (int)p->pCnf->nRoots)    );
        Counter++;
    }
    assert( p->pCnf->nClauses == Counter );

    // make sure the last clause if empty
    assert( p->pCnf->pTail->nLits == 0 );

    // go through the root unit clauses
    p->nTrailSize = 0;
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        // create watcher lists for the root clauses
        if ( pClause->nLits > 1 )
        {
            Intp_ManWatchClause( p, pClause, pClause->pLits[0] );
            Intp_ManWatchClause( p, pClause, pClause->pLits[1] );
        }
        // empty clause and large clauses
        if ( pClause->nLits != 1 )
            continue;
        // unit clause
        assert( lit_check(pClause->pLits[0], p->pCnf->nVars) );
        if ( !Intp_ManEnqueue( p, pClause->pLits[0], pClause ) )
        {
            // detected root level conflict
//            printf( "Error in Intp_ManProcessRoots(): Detected a root-level conflict too early!\n" );
//            assert( 0 );
            // detected root level conflict
            Intp_ManProofTraceOne( p, pClause, p->pCnf->pEmpty );
            if ( p->fVerbose )
                printf( "Found root level conflict!\n" );
            return 0;
        }
    }

    // propagate the root unit clauses
    pClause = Intp_ManPropagate( p, 0 );
    if ( pClause )
    {
        // detected root level conflict
        Intp_ManProofTraceOne( p, pClause, p->pCnf->pEmpty );
        if ( p->fVerbose )
            printf( "Found root level conflict!\n" );
        return 0;
    }

    // set the root level
    p->nRootSize = p->nTrailSize;
    return 1;
}